

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trp_print_divided_node_up_to_name(trt_node *node,ly_out *out)

{
  size_t sVar1;
  int local_1c;
  uint32_t space;
  ly_out *out_local;
  trt_node *node_local;
  
  sVar1 = strlen(node->flags);
  if ((node->name).type == TRD_NODE_CASE) {
    local_1c = (int)sVar1 + 2;
  }
  else {
    local_1c = (int)sVar1 + 1;
  }
  ly_print_(out,"%*c",(ulong)(local_1c + 2),0x20);
  return;
}

Assistant:

static void
trp_print_divided_node_up_to_name(const struct trt_node *node, struct ly_out *out)
{
    uint32_t space = strlen(node->flags);

    if (node->name.type == TRD_NODE_CASE) {
        /* :(<name> */
        space += strlen(TRD_NODE_NAME_PREFIX_CASE);
    } else if (node->name.type == TRD_NODE_CHOICE) {
        /* (<name> */
        space += strlen(TRD_NODE_NAME_PREFIX_CHOICE);
    } else {
        /* _<name> */
        space += strlen(" ");
    }

    /* <name>
     * __
     */
    space += TRD_INDENT_LONG_LINE_BREAK;

    ly_print_(out, "%*c", space, ' ');
}